

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_ObjLabelTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,int fFirst)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar5 = (p->vObjTrav).pArray;
    iVar7 = p->nObjTravs - piVar5[(uint)iObj];
    iVar4 = iVar7;
    if (2 < iVar7) {
      piVar5 = piVar5 + (uint)iObj;
      *piVar5 = p->nObjTravs + -2;
      if (iObj == 0) {
LAB_003a2769:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
LAB_003a2788:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      iVar4 = 2;
      if ((p->vObjType).pArray[(uint)iObj] != '\x04') {
        if ((p->vLevelD).nSize <= iObj) goto LAB_003a274a;
        iVar4 = (p->vLevelD).pArray[(uint)iObj];
        if (nTfoLevMax < iVar4) {
          return 2;
        }
        if (iVar4 != nTfoLevMax) {
          if ((p->vFanouts).nSize <= iObj) {
LAB_003a26d4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          if ((p->vFanouts).pArray[(uint)iObj].nSize <= nFanMax) {
            if (iObj < (p->vFanouts).nSize) {
              lVar6 = 0;
              bVar2 = false;
              do {
                pVVar1 = (p->vFanouts).pArray;
                if (pVVar1[(uint)iObj].nSize <= lVar6) {
                  if ((iVar7 == 3) || (!bVar2)) {
                    Acb_ObjSetTravIdDiff(p,iObj,(uint)(bVar2 && iVar7 == 3));
                  }
                  if ((p->vObjTrav).nSize <= iObj) goto LAB_003a274a;
                  piVar5 = (p->vObjTrav).pArray + (uint)iObj;
                  goto LAB_003a2736;
                }
                iVar4 = pVVar1[(uint)iObj].pArray[lVar6];
                if ((long)iVar4 < 1) goto LAB_003a2769;
                if ((p->vObjType).nSize <= iVar4) goto LAB_003a2788;
                if (((p->vObjType).pArray[iVar4] != '\0') &&
                   ((fFirst == 0 || (iVar3 = Acb_ObjIsDelayCriticalFanin(p,iVar4,iObj), iVar3 != 0))
                   )) {
                  iVar4 = Acb_ObjLabelTfo_rec(p,iVar4,nTfoLevMax,nFanMax,0);
                  bVar2 = (bool)(bVar2 | iVar4 == 2);
                }
                lVar6 = lVar6 + 1;
              } while (iObj < (p->vFanouts).nSize);
            }
            goto LAB_003a26d4;
          }
        }
        if (iVar7 == 3) {
          if ((p->vObjTrav).nSize <= iObj) goto LAB_003a274a;
          *piVar5 = p->nObjTravs + -1;
        }
        if ((p->vObjTrav).nSize <= iObj) goto LAB_003a274a;
LAB_003a2736:
        iVar4 = p->nObjTravs - *piVar5;
      }
    }
    return iVar4;
  }
LAB_003a274a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_ObjLabelTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, int fFirst )
{
    int iFanout, i, Diff, fHasNone = 0;
    if ( (Diff = Acb_ObjTravIdDiff(p, iObj)) <= 2 )
        return Diff;
    Acb_ObjSetTravIdDiff( p, iObj, 2 );
    if ( Acb_ObjIsCo(p, iObj) || Acb_ObjLevelD(p, iObj) > nTfoLevMax )
        return 2;
    if ( Acb_ObjLevelD(p, iObj) == nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
    {
        if ( Diff == 3 )  // belongs to TFO of TFI
            Acb_ObjSetTravIdDiff( p, iObj, 1 ); // root
        return Acb_ObjTravIdDiff(p, iObj);
    }
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        if ( !fFirst || Acb_ObjIsDelayCriticalFanin(p, iFanout, iObj) )
            fHasNone |= 2 == Acb_ObjLabelTfo_rec( p, iFanout, nTfoLevMax, nFanMax, 0 );
    if ( fHasNone && Diff == 3 )  // belongs to TFO of TFI
        Acb_ObjSetTravIdDiff( p, iObj, 1 ); // root
    else if ( !fHasNone )
        Acb_ObjSetTravIdDiff( p, iObj, 0 ); // inner
    return Acb_ObjTravIdDiff(p, iObj);
}